

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

int __thiscall sjtu::UserManager::init(UserManager *this,EVP_PKEY_CTX *ctx)

{
  uint *puVar1;
  int iVar2;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar3;
  FileManager<sjtu::userType> *pFVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ofstream outfile;
  string local_2a8;
  long *local_288 [2];
  long local_278 [2];
  string local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [272];
  
  if ((int)ctx == 0) {
    pBVar3 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"UserBpTree.dat","");
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar3,&local_2a8,0x100);
    this->UserBpTree = pBVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    pFVar4 = (FileManager<sjtu::userType> *)operator_new(0x228);
    paVar6 = &local_268.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"UserFile.dat","");
    FileManager<sjtu::userType>::FileManager(pFVar4,&local_268,0x20);
    this->UserFile = pFVar4;
    _Var5._M_p = local_268._M_dataplus._M_p;
  }
  else {
    pBVar3 = this->UserBpTree;
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"UserBpTree.dat","");
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar3,(EVP_PKEY_CTX *)local_288);
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    pFVar4 = this->UserFile;
    paVar6 = &local_238;
    local_248[0] = paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"UserFile.dat","");
    (**(pFVar4->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base)
              (pFVar4,(string *)local_248,0x20,1);
    _Var5._M_p = (pointer)local_248[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
  puVar1 = &this->online_flag;
  if ((this->UserFile->super_FileManager_Base<sjtu::userType>).is_newfile == true) {
    std::ofstream::ofstream(&local_228,"OnlineFlag.dat",_S_out|_S_bin);
    *puVar1 = 0;
    std::ostream::write((char *)&local_228,(long)puVar1);
    std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _tellp;
    std::filebuf::~filebuf(local_220);
    iVar2 = std::ios_base::~ios_base(local_130);
  }
  else {
    std::ifstream::ifstream(&local_228,"OnlineFlag.dat",_S_in);
    std::istream::read((char *)&local_228,(long)puVar1);
    std::ifstream::close();
    iVar2 = std::ifstream::~ifstream(&local_228);
  }
  this->online_flag = this->online_flag + 1;
  return iVar2;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                UserBpTree = new BplusTree<StringHasher::hashType, locType>(std::string("UserBpTree.dat") , UserBpTree_cache_size);
                UserFile = new FileManager<userType>(std::string("UserFile.dat") , UserFile_cache_size);
            } else {
                UserBpTree->init(std::string("UserBpTree.dat") , UserBpTree_cache_size , true);
                UserFile->init(std::string("UserFile.dat") , UserFile_cache_size , true);
            }
            if (UserFile -> is_newfile)
            {
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	online_flag = 0 , outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
            }
            else
            {
            	std::ifstream infile("OnlineFlag.dat" , std::ios_base::in);
            	infile.read(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	infile.close();
            }
            ++ online_flag;
        }